

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChargeHistogram.cpp
# Opt level: O0

void __thiscall OpenMD::ChargeHistogram::writeCharge(ChargeHistogram *this)

{
  byte bVar1;
  char *pcVar2;
  ostream *poVar3;
  size_type sVar4;
  reference pvVar5;
  undefined8 uVar6;
  long in_RDI;
  uint i;
  ofstream rdfStream;
  uint local_218;
  ostream local_208 [520];
  
  pcVar2 = (char *)std::__cxx11::string::c_str();
  std::ofstream::ofstream(local_208,pcVar2,_S_out);
  bVar1 = std::ofstream::is_open();
  if ((bVar1 & 1) == 0) {
    uVar6 = std::__cxx11::string::c_str();
    snprintf(painCave.errMsg,2000,"ChargeHistogram: unable to open %s\n",uVar6);
    painCave.isFatal = 1;
    simError();
  }
  else {
    std::operator<<(local_208,"#Charges for selection\n");
    poVar3 = std::operator<<(local_208,"#nFrames:\t");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(int *)(in_RDI + 0xd0));
    std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(local_208,"#selection: (");
    poVar3 = std::operator<<(poVar3,(string *)(in_RDI + 0xd8));
    std::operator<<(poVar3,")\n");
    poVar3 = std::operator<<(local_208,"#");
    poVar3 = std::operator<<(poVar3,"Bin_center");
    std::operator<<(poVar3,"\tcount\n");
    for (local_218 = 0;
        sVar4 = std::vector<double,_std::allocator<double>_>::size
                          ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x730)),
        local_218 < sVar4; local_218 = local_218 + 1) {
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x718),
                          (ulong)local_218);
      poVar3 = (ostream *)std::ostream::operator<<(local_208,*pvVar5);
      poVar3 = std::operator<<(poVar3,"\t");
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x730),
                          (ulong)local_218);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,*pvVar5);
      std::operator<<(poVar3,"\n");
    }
  }
  std::ofstream::close();
  std::ofstream::~ofstream(local_208);
  return;
}

Assistant:

void ChargeHistogram::writeCharge() {
    std::ofstream rdfStream(outputFilename_.c_str());
    if (rdfStream.is_open()) {
      rdfStream << "#Charges for selection\n";
      rdfStream << "#nFrames:\t" << nProcessed_ << "\n";
      rdfStream << "#selection: (" << selectionScript_ << ")\n";
      rdfStream << "#"
                << "Bin_center"
                << "\tcount\n";
      for (unsigned int i = 0; i < histList_.size(); ++i) {
        rdfStream << bincenter_[i] << "\t" << histList_[i] << "\n";
      }
    } else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "ChargeHistogram: unable to open %s\n", outputFilename_.c_str());
      painCave.isFatal = 1;
      simError();
    }
    rdfStream.close();
  }